

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

void __thiscall
Fl_Preferences::Fl_Preferences(Fl_Preferences *this,Fl_Preferences *parent,int groupIndex)

{
  int iVar1;
  Node *pNVar2;
  
  this->_vptr_Fl_Preferences = (_func_int **)&PTR__Fl_Plugin_Manager_00278cb8;
  this->rootNode = parent->rootNode;
  if (-1 < groupIndex) {
    iVar1 = groups(parent);
    if (groupIndex < iVar1) {
      pNVar2 = Node::childNode(parent->node,groupIndex);
      goto LAB_001c1975;
    }
  }
  pNVar2 = parent->node;
  newUUID();
  pNVar2 = Node::addChild(pNVar2,uuidBuffer);
LAB_001c1975:
  this->node = pNVar2;
  return;
}

Assistant:

Fl_Preferences::Fl_Preferences( Fl_Preferences &parent, int groupIndex ) {
  rootNode = parent.rootNode;
  if (groupIndex<0 || groupIndex>=parent.groups()) {
    node = parent.node->addChild( newUUID() );
  } else {
    node = parent.node->childNode( groupIndex );
  }
}